

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O1

uint32_t __thiscall
bits::detail::
RadixSort<8U,_unsigned_int,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>::
operator()(RadixSort<8U,_unsigned_int,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>
           *this,uint *keys_in,uint *keys_temp,uint *values_in,uint *values_temp,uint32_t size)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  uint uVar10;
  uint *puVar11;
  long lVar12;
  ulong uVar13;
  uint *values [2];
  uint *keys [2];
  uint32_t sum [4];
  uint32_t hist [4] [256];
  uint *local_1078 [6];
  uint auStack_1048 [4];
  uint local_1038 [768];
  uint auStack_438 [258];
  
  uVar5 = (ulong)size;
  memset(local_1038,0,0x1000);
  if (size != 0) {
    uVar9 = 0;
    do {
      uVar6 = keys_in[uVar9];
      lVar7 = 0;
      puVar8 = local_1038;
      do {
        puVar8[uVar6 >> ((byte)lVar7 & 0x1f) & 0xff] =
             puVar8[uVar6 >> ((byte)lVar7 & 0x1f) & 0xff] + 1;
        lVar7 = lVar7 + 8;
        puVar8 = puVar8 + 0x100;
      } while (lVar7 != 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar5);
  }
  puVar8 = local_1038;
  lVar7 = 0;
  do {
    auStack_1048[lVar7] = *puVar8;
    *puVar8 = 0;
    lVar7 = lVar7 + 1;
    puVar8 = puVar8 + 0x100;
  } while (lVar7 != 4);
  lVar7 = 1;
  puVar8 = local_1038;
  do {
    puVar8 = puVar8 + 1;
    lVar12 = 0;
    puVar11 = puVar8;
    do {
      uVar6 = auStack_1048[lVar12];
      uVar1 = *puVar11;
      *puVar11 = uVar6;
      auStack_1048[lVar12] = uVar1 + uVar6;
      lVar12 = lVar12 + 1;
      puVar11 = puVar11 + 0x100;
    } while (lVar12 != 4);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  local_1078[2] = keys_in;
  local_1078[3] = keys_temp;
  local_1078[0] = values_in;
  local_1078[1] = values_temp;
  if (size != 0) {
    uVar9 = 0;
    do {
      uVar6 = keys_in[uVar9];
      uVar10 = uVar6 & 0xff;
      uVar1 = local_1038[uVar10];
      local_1038[uVar10] = uVar1 + 1;
      keys_temp[uVar1] = uVar6;
      values_temp[uVar1] = values_in[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  local_1078[4] = values_in;
  local_1078[5] = values_temp;
  lVar7 = 1;
  do {
    if (size != 0) {
      uVar6 = (uint)lVar7 & 1;
      uVar9 = (ulong)(uVar6 << 3);
      uVar13 = (ulong)((uVar6 ^ 1) << 3);
      lVar12 = *(long *)((long)local_1078 + uVar9 + 0x10);
      lVar2 = *(long *)((long)local_1078 + uVar13 + 0x10);
      lVar3 = *(long *)((long)local_1078 + uVar9);
      lVar4 = *(long *)((long)local_1078 + uVar13);
      uVar9 = 0;
      do {
        uVar6 = *(uint *)(lVar12 + uVar9 * 4);
        uVar13 = (ulong)(uVar6 >> ((char)lVar7 * '\b' & 0x1fU) & 0xff);
        uVar1 = local_1038[lVar7 * 0x100 + uVar13];
        local_1038[lVar7 * 0x100 + uVar13] = uVar1 + 1;
        *(uint *)(lVar2 + (ulong)uVar1 * 4) = uVar6;
        *(undefined4 *)(lVar4 + (ulong)uVar1 * 4) = *(undefined4 *)(lVar3 + uVar9 * 4);
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if (size != 0) {
    uVar9 = 0;
    do {
      uVar6 = keys_temp[uVar9];
      uVar10 = uVar6 >> 0x18;
      uVar1 = auStack_438[uVar10];
      auStack_438[uVar10] = uVar1 + 1;
      keys_in[uVar1] = uVar6;
      values_in[uVar1] = values_temp[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  return 0;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }